

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_row_mt(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  av1_extracfg *extra_cfg_00;
  aom_codec_alg_priv_t_conflict *in_RSI;
  long in_RDI;
  av1_extracfg extra_cfg;
  uint row_mt;
  undefined1 local_278 [24];
  int local_260;
  int local_1c;
  aom_codec_err_t local_4;
  
  uVar1 = *(uint *)&(in_RSI->base).err_detail;
  if (uVar1 < 0x29) {
    extra_cfg_00 = (av1_extracfg *)((long)(int)uVar1 + (long)(in_RSI->base).enc.cx_data_dst_buf.buf)
    ;
    *(uint *)&(in_RSI->base).err_detail = uVar1 + 8;
  }
  else {
    extra_cfg_00 = (av1_extracfg *)(in_RSI->base).init_flags;
    (in_RSI->base).init_flags = (aom_codec_flags_t)&extra_cfg_00->enable_auto_bwd_ref;
  }
  local_1c = extra_cfg_00->cpu_used;
  if (local_1c == *(int *)(in_RDI + 0x470)) {
    local_4 = AOM_CODEC_OK;
  }
  else {
    memcpy(local_278,(void *)(in_RDI + 0x458),600);
    local_260 = local_1c;
    local_4 = update_extra_cfg(in_RSI,extra_cfg_00);
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_row_mt(aom_codec_alg_priv_t *ctx,
                                       va_list args) {
  unsigned int row_mt = CAST(AV1E_SET_ROW_MT, args);
  if (row_mt == ctx->extra_cfg.row_mt) return AOM_CODEC_OK;
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  extra_cfg.row_mt = row_mt;
  return update_extra_cfg(ctx, &extra_cfg);
}